

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_sse4.c
# Opt level: O3

void av1_dr_prediction_z2_sse4_1
               (uint8_t *dst,ptrdiff_t stride,int bw,int bh,uint8_t *above,uint8_t *left,
               int upsample_above,int upsample_left,int dx,int dy)

{
  uint8_t auVar1 [16];
  long lVar2;
  byte bVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  short sVar12;
  uint uVar13;
  undefined4 uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  short sVar24;
  short sVar25;
  ushort uVar26;
  short sVar27;
  ushort uVar28;
  short sVar29;
  ushort uVar30;
  ushort uVar31;
  short sVar32;
  short sVar33;
  short sVar34;
  undefined1 in_XMM2 [16];
  short sVar35;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar48 [16];
  undefined1 in_XMM6 [16];
  undefined1 in_XMM7 [16];
  undefined1 in_XMM8 [16];
  undefined1 auVar49 [16];
  undefined1 in_XMM9 [16];
  ushort uVar50;
  undefined8 uVar51;
  ushort uVar55;
  ushort uVar56;
  ushort uVar58;
  ushort uVar59;
  ushort uVar60;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  ushort uVar57;
  ushort uVar61;
  undefined1 auVar54 [16];
  short sVar62;
  short sVar69;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  ulong uVar70;
  ushort uVar75;
  ushort uVar76;
  ushort uVar77;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  ushort uVar78;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  int local_60;
  uint local_5c;
  short sVar36;
  short sVar41;
  short sVar42;
  short sVar43;
  short sVar44;
  short sVar45;
  short sVar46;
  short sVar47;
  short sVar82;
  short sVar88;
  short sVar89;
  short sVar90;
  short sVar91;
  short sVar92;
  short sVar93;
  short sVar94;
  
  bVar3 = (byte)upsample_above;
  local_60 = bh;
  if (bw == 8) {
    iVar6 = -1 << (bVar3 & 0x1f);
    if (0 < bh) {
      auVar15 = ZEXT416((uint)(-1 << ((byte)upsample_left & 0x1f)));
      auVar15 = pshuflw(auVar15,auVar15,0);
      sVar24 = auVar15._0_2_;
      sVar25 = auVar15._2_2_;
      auVar15 = pshuflw(ZEXT416((uint)dy),ZEXT416((uint)dy),0);
      sVar27 = auVar15._0_2_;
      sVar29 = auVar15._2_2_;
      auVar15._0_2_ = (ushort)-sVar27 >> 1;
      auVar15._2_2_ = (ushort)(sVar29 * -2) >> 1;
      auVar15._4_2_ = (ushort)(sVar27 * -3) >> 1;
      auVar15._6_2_ = (ushort)(sVar29 * -4) >> 1;
      auVar15._8_2_ = (ushort)(sVar27 * -5) >> 1;
      auVar15._10_2_ = (ushort)(sVar29 * -6) >> 1;
      auVar15._12_2_ = (ushort)(sVar27 * -7) >> 1;
      auVar15._14_2_ = (ushort)(sVar29 * -8) >> 1;
      auVar15 = auVar15 & _DAT_0050db40;
      iVar8 = -dx;
      auVar49 = pmovsxbw(in_XMM6,0x1010101010101010);
      auVar16 = pmovsxbw(in_XMM8,0x1f1f1f1f1f1f1f1f);
      uVar11 = 0;
      uVar9 = dx;
      do {
        uVar10 = iVar8 >> (6 - bVar3 & 0x1f);
        iVar5 = (int)(~uVar10 + iVar6) >> (bVar3 & 0x1f);
        if (iVar6 + -1 <= (int)uVar10) {
          iVar5 = 0;
        }
        uVar13 = (int)((iVar6 + upsample_above) - uVar10) >> (bVar3 & 0x1f);
        if ((int)uVar13 < 1) {
          uVar13 = 0;
        }
        if (7 < (int)uVar13) {
          uVar13 = 8;
        }
        auVar53 = (undefined1  [16])0x0;
        if (iVar5 < 8) {
          auVar53 = *(undefined1 (*) [16])(above + (long)iVar5 + (long)(int)uVar10);
          auVar64 = pshuflw(ZEXT416(uVar9),ZEXT416(uVar9),0);
          sVar62 = auVar64._0_2_;
          auVar19._0_2_ = 0x80 - sVar62;
          sVar69 = auVar64._2_2_;
          auVar19._2_2_ = 0xc0 - sVar69;
          auVar19._4_2_ = 0x100 - sVar62;
          auVar19._6_2_ = 0x140 - sVar69;
          auVar19._8_2_ = 0x180 - sVar62;
          auVar19._10_2_ = 0x1c0 - sVar69;
          auVar19._12_2_ = 0x200 - sVar62;
          auVar19._14_2_ = -sVar69;
          if (upsample_above == 0) {
            auVar64 = pshufb(auVar53,(undefined1  [16])LoadMaskx[iVar5]);
            auVar53 = pshufb(auVar53 >> 8,(undefined1  [16])LoadMaskx[iVar5]);
          }
          else {
            auVar64 = pshufb(auVar53,(undefined1  [16])EvenOddMaskx[iVar5]);
            auVar53 = auVar64 >> 0x40;
            auVar19 = psllw(auVar19,ZEXT416((uint)upsample_above));
          }
          auVar66._0_2_ = auVar19._0_2_ >> 1;
          auVar66._2_2_ = auVar19._2_2_ >> 1;
          auVar66._4_2_ = auVar19._4_2_ >> 1;
          auVar66._6_2_ = auVar19._6_2_ >> 1;
          auVar66._8_2_ = auVar19._8_2_ >> 1;
          auVar66._10_2_ = auVar19._10_2_ >> 1;
          auVar66._12_2_ = auVar19._12_2_ >> 1;
          auVar66._14_2_ = auVar19._14_2_ >> 1;
          auVar64 = pmovzxbw(auVar64,auVar64);
          auVar19 = pmovzxbw(auVar53,auVar53);
          auVar53 = psllw(auVar64,5);
          auVar66 = auVar66 & auVar16;
          uVar26 = (ushort)(auVar66._0_2_ * (auVar19._0_2_ - auVar64._0_2_) + auVar53._0_2_ +
                           auVar49._0_2_) >> 5;
          uVar28 = (ushort)(auVar66._2_2_ * (auVar19._2_2_ - auVar64._2_2_) + auVar53._2_2_ +
                           auVar49._2_2_) >> 5;
          uVar30 = (ushort)(auVar66._4_2_ * (auVar19._4_2_ - auVar64._4_2_) + auVar53._4_2_ +
                           auVar49._4_2_) >> 5;
          uVar31 = (ushort)(auVar66._6_2_ * (auVar19._6_2_ - auVar64._6_2_) + auVar53._6_2_ +
                           auVar49._6_2_) >> 5;
          uVar50 = (ushort)(auVar66._8_2_ * (auVar19._8_2_ - auVar64._8_2_) + auVar53._8_2_ +
                           auVar49._8_2_) >> 5;
          uVar55 = (ushort)(auVar66._10_2_ * (auVar19._10_2_ - auVar64._10_2_) + auVar53._10_2_ +
                           auVar49._10_2_) >> 5;
          uVar56 = (ushort)(auVar66._12_2_ * (auVar19._12_2_ - auVar64._12_2_) + auVar53._12_2_ +
                           auVar49._12_2_) >> 5;
          uVar57 = (ushort)(auVar66._14_2_ * (auVar19._14_2_ - auVar64._14_2_) + auVar53._14_2_ +
                           auVar49._14_2_) >> 5;
          auVar53[1] = (uVar28 != 0) * (uVar28 < 0x100) * (char)uVar28 - (0xff < uVar28);
          auVar53[0] = (uVar26 != 0) * (uVar26 < 0x100) * (char)uVar26 - (0xff < uVar26);
          auVar53[2] = (uVar30 != 0) * (uVar30 < 0x100) * (char)uVar30 - (0xff < uVar30);
          auVar53[3] = (uVar31 != 0) * (uVar31 < 0x100) * (char)uVar31 - (0xff < uVar31);
          auVar53[4] = (uVar50 != 0) * (uVar50 < 0x100) * (char)uVar50 - (0xff < uVar50);
          auVar53[5] = (uVar55 != 0) * (uVar55 < 0x100) * (char)uVar55 - (0xff < uVar55);
          auVar53[6] = (uVar56 != 0) * (uVar56 < 0x100) * (char)uVar56 - (0xff < uVar56);
          auVar53[7] = (uVar57 != 0) * (uVar57 < 0x100) * (char)uVar57 - (0xff < uVar57);
          auVar53[8] = (uVar26 != 0) * (uVar26 < 0x100) * (char)uVar26 - (0xff < uVar26);
          auVar53[9] = (uVar28 != 0) * (uVar28 < 0x100) * (char)uVar28 - (0xff < uVar28);
          auVar53[10] = (uVar30 != 0) * (uVar30 < 0x100) * (char)uVar30 - (0xff < uVar30);
          auVar53[0xb] = (uVar31 != 0) * (uVar31 < 0x100) * (char)uVar31 - (0xff < uVar31);
          auVar53[0xc] = (uVar50 != 0) * (uVar50 < 0x100) * (char)uVar50 - (0xff < uVar50);
          auVar53[0xd] = (uVar55 != 0) * (uVar55 < 0x100) * (char)uVar55 - (0xff < uVar55);
          auVar53[0xe] = (uVar56 != 0) * (uVar56 < 0x100) * (char)uVar56 - (0xff < uVar56);
          auVar53[0xf] = (uVar57 != 0) * (uVar57 < 0x100) * (char)uVar57 - (0xff < uVar57);
        }
        uVar51 = auVar53._0_8_;
        if ((int)uVar10 < iVar6) {
          auVar64 = pshuflw(ZEXT416(uVar11),ZEXT416(uVar11),0);
          sVar62 = auVar64._0_2_;
          auVar37._0_2_ = sVar62 + -sVar27;
          sVar69 = auVar64._2_2_;
          auVar37._2_2_ = sVar69 + sVar29 * -2;
          auVar37._4_2_ = sVar62 + sVar27 * -3;
          auVar37._6_2_ = sVar69 + sVar29 * -4;
          auVar37._8_2_ = sVar62 + sVar27 * -5;
          auVar37._10_2_ = sVar69 + sVar29 * -6;
          auVar37._12_2_ = sVar62 + sVar27 * -7;
          auVar37._14_2_ = sVar69 + sVar29 * -8;
          auVar64 = auVar15;
          if (upsample_left != 0) {
            auVar19 = psllw(auVar37,ZEXT416((uint)upsample_left));
            auVar64._0_2_ = auVar19._0_2_ >> 1;
            auVar64._2_2_ = auVar19._2_2_ >> 1;
            auVar64._4_2_ = auVar19._4_2_ >> 1;
            auVar64._6_2_ = auVar19._6_2_ >> 1;
            auVar64._8_2_ = auVar19._8_2_ >> 1;
            auVar64._10_2_ = auVar19._10_2_ >> 1;
            auVar64._12_2_ = auVar19._12_2_ >> 1;
            auVar64._14_2_ = auVar19._14_2_ >> 1;
            auVar64 = auVar64 & auVar16;
          }
          auVar19 = psraw(auVar37,ZEXT416(6 - upsample_left));
          auVar71._0_2_ = -(ushort)(auVar19._0_2_ < sVar24);
          auVar71._2_2_ = -(ushort)(auVar19._2_2_ < sVar25);
          auVar71._4_2_ = -(ushort)(auVar19._4_2_ < sVar24);
          auVar71._6_2_ = -(ushort)(auVar19._6_2_ < sVar25);
          auVar71._8_2_ = -(ushort)(auVar19._8_2_ < sVar24);
          auVar71._10_2_ = -(ushort)(auVar19._10_2_ < sVar25);
          auVar71._12_2_ = -(ushort)(auVar19._12_2_ < sVar24);
          auVar71._14_2_ = -(ushort)(auVar19._14_2_ < sVar25);
          auVar19 = ~auVar71 & auVar19;
          auVar73._8_8_ =
               (ulong)left[auVar19._8_2_] | (ulong)left[auVar19._10_2_] << 0x10 |
               (ulong)left[auVar19._12_2_] << 0x20 | (ulong)(ushort)left[auVar19._14_2_] << 0x30;
          auVar73._0_8_ =
               (ulong)left[auVar19._0_2_] | (ulong)left[auVar19._2_2_] << 0x10 |
               (ulong)left[auVar19._4_2_] << 0x20 | (ulong)(ushort)left[auVar19._6_2_] << 0x30;
          auVar66 = psllw(auVar73,5);
          uVar26 = (ushort)(auVar66._0_2_ +
                            ((ushort)left[(short)(auVar19._0_2_ + 1)] - (ushort)left[auVar19._0_2_])
                            * auVar64._0_2_ + auVar49._0_2_) >> 5;
          uVar28 = (ushort)(auVar66._2_2_ +
                            ((ushort)left[(short)(auVar19._2_2_ + 1)] - (ushort)left[auVar19._2_2_])
                            * auVar64._2_2_ + auVar49._2_2_) >> 5;
          uVar30 = (ushort)(auVar66._4_2_ +
                            ((ushort)left[(short)(auVar19._4_2_ + 1)] - (ushort)left[auVar19._4_2_])
                            * auVar64._4_2_ + auVar49._4_2_) >> 5;
          uVar31 = (ushort)(auVar66._6_2_ +
                            ((ushort)left[(short)(auVar19._6_2_ + 1)] - (ushort)left[auVar19._6_2_])
                            * auVar64._6_2_ + auVar49._6_2_) >> 5;
          uVar50 = (ushort)(auVar66._8_2_ +
                            ((ushort)left[(short)(auVar19._8_2_ + 1)] - (ushort)left[auVar19._8_2_])
                            * auVar64._8_2_ + auVar49._8_2_) >> 5;
          uVar55 = (ushort)(auVar66._10_2_ +
                            ((ushort)left[(short)(auVar19._10_2_ + 1)] -
                            (ushort)left[auVar19._10_2_]) * auVar64._10_2_ + auVar49._10_2_) >> 5;
          uVar56 = (ushort)(auVar66._12_2_ +
                            ((ushort)left[(short)(auVar19._12_2_ + 1)] -
                            (ushort)left[auVar19._12_2_]) * auVar64._12_2_ + auVar49._12_2_) >> 5;
          uVar57 = (ushort)(auVar66._14_2_ +
                            ((ushort)left[(short)(auVar19._14_2_ + 1)] -
                            (ushort)left[auVar19._14_2_]) * auVar64._14_2_ + auVar49._14_2_) >> 5;
          auVar74[1] = (uVar28 != 0) * (uVar28 < 0x100) * (char)uVar28 - (0xff < uVar28);
          auVar74[0] = (uVar26 != 0) * (uVar26 < 0x100) * (char)uVar26 - (0xff < uVar26);
          auVar74[2] = (uVar30 != 0) * (uVar30 < 0x100) * (char)uVar30 - (0xff < uVar30);
          auVar74[3] = (uVar31 != 0) * (uVar31 < 0x100) * (char)uVar31 - (0xff < uVar31);
          auVar74[4] = (uVar50 != 0) * (uVar50 < 0x100) * (char)uVar50 - (0xff < uVar50);
          auVar74[5] = (uVar55 != 0) * (uVar55 < 0x100) * (char)uVar55 - (0xff < uVar55);
          auVar74[6] = (uVar56 != 0) * (uVar56 < 0x100) * (char)uVar56 - (0xff < uVar56);
          auVar74[7] = (uVar57 != 0) * (uVar57 < 0x100) * (char)uVar57 - (0xff < uVar57);
          auVar74[8] = (uVar26 != 0) * (uVar26 < 0x100) * (char)uVar26 - (0xff < uVar26);
          auVar74[9] = (uVar28 != 0) * (uVar28 < 0x100) * (char)uVar28 - (0xff < uVar28);
          auVar74[10] = (uVar30 != 0) * (uVar30 < 0x100) * (char)uVar30 - (0xff < uVar30);
          auVar74[0xb] = (uVar31 != 0) * (uVar31 < 0x100) * (char)uVar31 - (0xff < uVar31);
          auVar74[0xc] = (uVar50 != 0) * (uVar50 < 0x100) * (char)uVar50 - (0xff < uVar50);
          auVar74[0xd] = (uVar55 != 0) * (uVar55 < 0x100) * (char)uVar55 - (0xff < uVar55);
          auVar74[0xe] = (uVar56 != 0) * (uVar56 < 0x100) * (char)uVar56 - (0xff < uVar56);
          auVar74[0xf] = (uVar57 != 0) * (uVar57 < 0x100) * (char)uVar57 - (0xff < uVar57);
          auVar53 = pblendvb(auVar53,auVar74,(undefined1  [16])Mask[0][uVar13]);
          uVar51 = auVar53._0_8_;
        }
        *(undefined8 *)dst = uVar51;
        dst = dst + stride;
        uVar11 = uVar11 + 0x40;
        iVar8 = iVar8 - dx;
        uVar9 = uVar9 + dx;
        local_60 = local_60 + -1;
      } while (local_60 != 0);
    }
  }
  else if (bw == 4) {
    iVar6 = -1 << (bVar3 & 0x1f);
    if (0 < bh) {
      auVar15 = ZEXT416((uint)(-1 << ((byte)upsample_left & 0x1f)));
      auVar15 = pshuflw(auVar15,auVar15,0);
      sVar24 = auVar15._0_2_;
      sVar25 = auVar15._2_2_;
      auVar15 = pshuflw(ZEXT416((uint)dy),ZEXT416((uint)dy),0);
      uVar26 = -auVar15._0_2_;
      uVar28 = auVar15._2_2_ * -2;
      uVar30 = auVar15._0_2_ * -3;
      uVar31 = auVar15._2_2_ * -4;
      uVar7 = (ulong)DAT_0050db40;
      iVar8 = -dx;
      auVar15 = pmovsxbw(in_XMM7,0x1f1f1f1f1f1f1f1f);
      auVar49 = pmovsxbw(in_XMM8,0x1010101010101010);
      uVar11 = 0;
      uVar9 = dx;
      do {
        uVar10 = iVar8 >> (6 - bVar3 & 0x1f);
        iVar5 = (int)(~uVar10 + iVar6) >> (bVar3 & 0x1f);
        if (iVar6 + -1 <= (int)uVar10) {
          iVar5 = 0;
        }
        uVar13 = (int)((iVar6 + upsample_above) - uVar10) >> (bVar3 & 0x1f);
        if ((int)uVar13 < 1) {
          uVar13 = 0;
        }
        if (3 < (int)uVar13) {
          uVar13 = 4;
        }
        auVar16 = (undefined1  [16])0x0;
        auVar63 = (undefined1  [16])0x0;
        auVar52 = (undefined1  [16])0x0;
        if (iVar5 < 4) {
          auVar16 = pshuflw(ZEXT416(uVar9),ZEXT416(uVar9),0);
          sVar27 = auVar16._0_2_;
          sVar29 = auVar16._2_2_;
          auVar17._2_2_ = 0x40 - sVar29;
          auVar17._0_2_ = -sVar27;
          auVar17._4_2_ = 0x80 - sVar27;
          auVar17._6_2_ = 0xc0 - sVar29;
          auVar17._8_2_ = 0x100 - sVar27;
          auVar17._10_2_ = -sVar29;
          auVar17._12_2_ = -sVar27;
          auVar17._14_2_ = -sVar29;
          if (upsample_above == 0) {
            auVar53 = pshufb(*(undefined1 (*) [16])(above + (long)iVar5 + (long)(int)uVar10),
                             (undefined1  [16])LoadMaskx[iVar5]);
            auVar64 = auVar53 >> 8;
          }
          else {
            auVar53 = pshufb(*(undefined1 (*) [16])(above + (long)iVar5 + (long)(int)uVar10),
                             (undefined1  [16])EvenOddMaskx[iVar5]);
            auVar64 = auVar53 >> 0x40;
            auVar17 = psllw(auVar17,ZEXT416((uint)upsample_above));
          }
          auVar18._0_2_ = auVar17._0_2_ >> 1;
          auVar18._2_2_ = auVar17._2_2_ >> 1;
          auVar18._4_2_ = auVar17._4_2_ >> 1;
          auVar18._6_2_ = auVar17._6_2_ >> 1;
          auVar18._8_2_ = auVar17._8_2_ >> 1;
          auVar18._10_2_ = auVar17._10_2_ >> 1;
          auVar18._12_2_ = auVar17._12_2_ >> 1;
          auVar18._14_2_ = auVar17._14_2_ >> 1;
          auVar16 = auVar18 & auVar15;
          auVar52 = pmovzxbw(auVar53,auVar53);
          auVar63 = pmovzxbw(auVar64,auVar64);
        }
        if ((int)uVar10 < iVar6) {
          auVar53 = pshuflw(ZEXT416(uVar11),ZEXT416(uVar11),0);
          sVar27 = auVar53._0_2_;
          auVar83._0_2_ = sVar27 + uVar26;
          sVar29 = auVar53._2_2_;
          auVar83._2_2_ = sVar29 + uVar28;
          auVar83._4_2_ = sVar27 + uVar30;
          auVar83._6_2_ = sVar29 + uVar31;
          auVar83._8_2_ = sVar27;
          auVar83._10_2_ = sVar29;
          auVar83._12_2_ = sVar27;
          auVar83._14_2_ = sVar29;
          uVar70 = CONCAT26(uVar31 >> 1,CONCAT24(uVar30 >> 1,CONCAT22(uVar28 >> 1,uVar26 >> 1))) &
                   uVar7;
          if (upsample_left != 0) {
            auVar53 = psllw(auVar83,ZEXT416((uint)upsample_left));
            uVar70 = CONCAT26(auVar53._6_2_ >> 1,
                              CONCAT24(auVar53._4_2_ >> 1,
                                       CONCAT22(auVar53._2_2_ >> 1,auVar53._0_2_ >> 1))) &
                     auVar15._0_8_;
          }
          auVar53 = psraw(auVar83,ZEXT416(6 - upsample_left));
          auVar79._0_2_ = -(ushort)(auVar53._0_2_ < sVar24);
          auVar79._2_2_ = -(ushort)(auVar53._2_2_ < sVar25);
          auVar79._4_2_ = -(ushort)(auVar53._4_2_ < sVar24);
          auVar79._6_2_ = -(ushort)(auVar53._6_2_ < sVar25);
          auVar79._8_2_ = -(ushort)(auVar53._8_2_ < sVar24);
          auVar79._10_2_ = -(ushort)(auVar53._10_2_ < sVar25);
          auVar79._12_2_ = -(ushort)(auVar53._12_2_ < sVar24);
          auVar79._14_2_ = -(ushort)(auVar53._14_2_ < sVar25);
          auVar53 = ~auVar79 & auVar53;
          auVar52._8_8_ =
               (ulong)left[auVar53._0_2_] | (ulong)left[auVar53._2_2_] << 0x10 |
               (ulong)left[auVar53._4_2_] << 0x20 | (ulong)left[auVar53._6_2_] << 0x30;
          auVar63._8_8_ =
               (ulong)left[(short)(auVar53._0_2_ + 1)] |
               (ulong)left[(short)(auVar53._2_2_ + 1)] << 0x10 |
               (ulong)left[(short)(auVar53._4_2_ + 1)] << 0x20 |
               (ulong)left[(short)(auVar53._6_2_ + 1)] << 0x30;
          auVar16._8_8_ = uVar70;
        }
        auVar53 = psllw(auVar52,5);
        uVar50 = (ushort)(auVar53._0_2_ + (auVar63._0_2_ - auVar52._0_2_) * auVar16._0_2_ +
                         auVar49._0_2_) >> 5;
        uVar55 = (ushort)(auVar53._2_2_ + (auVar63._2_2_ - auVar52._2_2_) * auVar16._2_2_ +
                         auVar49._2_2_) >> 5;
        uVar56 = (ushort)(auVar53._4_2_ + (auVar63._4_2_ - auVar52._4_2_) * auVar16._4_2_ +
                         auVar49._4_2_) >> 5;
        uVar57 = (ushort)(auVar53._6_2_ + (auVar63._6_2_ - auVar52._6_2_) * auVar16._6_2_ +
                         auVar49._6_2_) >> 5;
        uVar58 = (ushort)(auVar53._8_2_ + (auVar63._8_2_ - auVar52._8_2_) * auVar16._8_2_ +
                         auVar49._8_2_) >> 5;
        uVar59 = (ushort)(auVar53._10_2_ + (auVar63._10_2_ - auVar52._10_2_) * auVar16._10_2_ +
                         auVar49._10_2_) >> 5;
        uVar60 = (ushort)(auVar53._12_2_ + (auVar63._12_2_ - auVar52._12_2_) * auVar16._12_2_ +
                         auVar49._12_2_) >> 5;
        uVar61 = (ushort)(auVar53._14_2_ + (auVar63._14_2_ - auVar52._14_2_) * auVar16._14_2_ +
                         auVar49._14_2_) >> 5;
        auVar54._0_8_ =
             CONCAT17((uVar61 != 0) * (uVar61 < 0x100) * (char)uVar61 - (0xff < uVar61),
                      CONCAT16((uVar60 != 0) * (uVar60 < 0x100) * (char)uVar60 - (0xff < uVar60),
                               CONCAT15((uVar59 != 0) * (uVar59 < 0x100) * (char)uVar59 -
                                        (0xff < uVar59),
                                        CONCAT14((uVar58 != 0) * (uVar58 < 0x100) * (char)uVar58 -
                                                 (0xff < uVar58),
                                                 CONCAT13((uVar57 != 0) * (uVar57 < 0x100) *
                                                          (char)uVar57 - (0xff < uVar57),
                                                          CONCAT12((uVar56 != 0) * (uVar56 < 0x100)
                                                                   * (char)uVar56 - (0xff < uVar56),
                                                                   CONCAT11((uVar55 != 0) *
                                                                            (uVar55 < 0x100) *
                                                                            (char)uVar55 -
                                                                            (0xff < uVar55),
                                                                            (uVar50 != 0) *
                                                                            (uVar50 < 0x100) *
                                                                            (char)uVar50 -
                                                                            (0xff < uVar50))))))));
        auVar54[8] = (uVar50 != 0) * (uVar50 < 0x100) * (char)uVar50 - (0xff < uVar50);
        auVar54[9] = (uVar55 != 0) * (uVar55 < 0x100) * (char)uVar55 - (0xff < uVar55);
        auVar54[10] = (uVar56 != 0) * (uVar56 < 0x100) * (char)uVar56 - (0xff < uVar56);
        auVar54[0xb] = (uVar57 != 0) * (uVar57 < 0x100) * (char)uVar57 - (0xff < uVar57);
        auVar54[0xc] = (uVar58 != 0) * (uVar58 < 0x100) * (char)uVar58 - (0xff < uVar58);
        auVar54[0xd] = (uVar59 != 0) * (uVar59 < 0x100) * (char)uVar59 - (0xff < uVar59);
        auVar54[0xe] = (uVar60 != 0) * (uVar60 < 0x100) * (char)uVar60 - (0xff < uVar60);
        auVar54[0xf] = (uVar61 != 0) * (uVar61 < 0x100) * (char)uVar61 - (0xff < uVar61);
        uVar14 = (undefined4)((ulong)auVar54._0_8_ >> 0x20);
        auVar65._4_4_ = uVar14;
        auVar65._0_4_ = uVar14;
        auVar65._8_4_ = uVar14;
        auVar65._12_4_ = uVar14;
        auVar16 = pblendvb(auVar54,auVar65,(undefined1  [16])Mask[0][uVar13]);
        *(int *)dst = auVar16._0_4_;
        dst = dst + stride;
        uVar11 = uVar11 + 0x40;
        iVar8 = iVar8 - dx;
        uVar9 = uVar9 + dx;
        local_60 = local_60 + -1;
      } while (local_60 != 0);
    }
  }
  else if (0 < bh) {
    auVar15 = pshuflw(ZEXT416((uint)dy),ZEXT416((uint)dy),0);
    sVar24 = auVar15._0_2_;
    sVar25 = auVar15._2_2_;
    auVar15 = pmovsxbw(in_XMM2,0x1010101010101010);
    auVar49 = pmovsxbw(in_XMM8,0x1f1f1f1f1f1f1f1f);
    auVar16 = pmovsxbw(in_XMM9,0xfefefefefefefefe);
    local_5c = 0;
    do {
      if (0 < bw) {
        uVar11 = (int)(~local_5c * dx) >> 6;
        uVar9 = ~uVar11;
        auVar53 = ZEXT416(~local_5c * dx >> 1 & 0x1f);
        auVar53 = pshuflw(auVar53,auVar53,0);
        auVar64 = pshuflw(ZEXT416(local_5c),ZEXT416(local_5c),0);
        uVar14 = auVar64._0_4_;
        auVar48._4_4_ = uVar14;
        auVar48._0_4_ = uVar14;
        auVar48._8_4_ = uVar14;
        auVar48._12_4_ = uVar14;
        auVar64 = psllw(auVar48,6);
        lVar4 = 0;
        do {
          uVar10 = uVar9 - 1;
          if (-3 < lVar4 + (int)uVar11) {
            uVar10 = 0;
          }
          uVar13 = 0;
          if (0 < (int)uVar9) {
            uVar13 = uVar9;
          }
          uVar7 = (ulong)uVar13;
          if (0xf < (int)uVar13) {
            uVar7 = 0x10;
          }
          auVar84 = (undefined1  [16])0x0;
          auVar72 = (undefined1  [16])0x0;
          sVar27 = auVar15._0_2_;
          sVar29 = auVar15._2_2_;
          sVar62 = auVar15._4_2_;
          sVar69 = auVar15._6_2_;
          sVar32 = auVar15._8_2_;
          sVar33 = auVar15._10_2_;
          sVar34 = auVar15._12_2_;
          sVar35 = auVar15._14_2_;
          if ((int)uVar10 < 0x10) {
            lVar2 = (ulong)uVar10 + (long)(int)uVar11;
            auVar1 = LoadMaskx[uVar10];
            auVar19 = pshufb(*(undefined1 (*) [16])(above + lVar4 + lVar2),(undefined1  [16])auVar1)
            ;
            auVar37 = pshufb(*(undefined1 (*) [16])(above + lVar4 + 1 + lVar2),
                             (undefined1  [16])auVar1);
            auVar73 = pmovzxbw((undefined1  [16])0x0,auVar19);
            auVar66 = pmovzxbw((undefined1  [16])auVar1,auVar37);
            auVar74 = psllw(auVar73,5);
            sVar12 = auVar53._0_2_;
            sVar36 = auVar53._2_2_;
            uVar58 = (ushort)(auVar74._0_2_ + sVar27 + (auVar66._0_2_ - auVar73._0_2_) * sVar12) >>
                     5;
            uVar59 = (ushort)(auVar74._2_2_ + sVar29 + (auVar66._2_2_ - auVar73._2_2_) * sVar36) >>
                     5;
            uVar60 = (ushort)(auVar74._4_2_ + sVar62 + (auVar66._4_2_ - auVar73._4_2_) * sVar12) >>
                     5;
            uVar61 = (ushort)(auVar74._6_2_ + sVar69 + (auVar66._6_2_ - auVar73._6_2_) * sVar36) >>
                     5;
            uVar75 = (ushort)(auVar74._8_2_ + sVar32 + (auVar66._8_2_ - auVar73._8_2_) * sVar12) >>
                     5;
            uVar76 = (ushort)(auVar74._10_2_ + sVar33 + (auVar66._10_2_ - auVar73._10_2_) * sVar36)
                     >> 5;
            uVar77 = (ushort)(auVar74._12_2_ + sVar34 + (auVar66._12_2_ - auVar73._12_2_) * sVar12)
                     >> 5;
            uVar78 = (ushort)(auVar74._14_2_ + sVar35 + (auVar66._14_2_ - auVar73._14_2_) * sVar36)
                     >> 5;
            auVar20._0_2_ = CONCAT11(0,auVar19[8]);
            auVar20[2] = auVar19[9];
            auVar20[3] = 0;
            auVar20[4] = auVar19[10];
            auVar20[5] = 0;
            auVar20[6] = auVar19[0xb];
            auVar20[7] = 0;
            auVar20[8] = auVar19[0xc];
            auVar20[9] = 0;
            auVar20[10] = auVar19[0xd];
            auVar20[0xb] = 0;
            auVar20[0xc] = auVar19[0xe];
            auVar20[0xd] = 0;
            auVar20[0xe] = auVar19[0xf];
            auVar20[0xf] = 0;
            auVar66 = psllw(auVar20,5);
            uVar26 = (ushort)(auVar66._0_2_ + sVar27 + (auVar37[8] - auVar20._0_2_) * sVar12) >> 5;
            uVar28 = (ushort)(auVar66._2_2_ + sVar29 +
                             ((ushort)auVar37[9] - (ushort)auVar19[9]) * sVar36) >> 5;
            uVar30 = (ushort)(auVar66._4_2_ + sVar62 +
                             ((ushort)auVar37[10] - (ushort)auVar19[10]) * sVar12) >> 5;
            uVar31 = (ushort)(auVar66._6_2_ + sVar69 +
                             ((ushort)auVar37[0xb] - (ushort)auVar19[0xb]) * sVar36) >> 5;
            uVar50 = (ushort)(auVar66._8_2_ + sVar32 +
                             ((ushort)auVar37[0xc] - (ushort)auVar19[0xc]) * sVar12) >> 5;
            uVar55 = (ushort)(auVar66._10_2_ + sVar33 +
                             ((ushort)auVar37[0xd] - (ushort)auVar19[0xd]) * sVar36) >> 5;
            uVar56 = (ushort)(auVar66._12_2_ + sVar34 +
                             ((ushort)auVar37[0xe] - (ushort)auVar19[0xe]) * sVar12) >> 5;
            uVar57 = (ushort)(auVar66._14_2_ + sVar35 +
                             ((ushort)auVar37[0xf] - (ushort)auVar19[0xf]) * sVar36) >> 5;
            auVar72[1] = (uVar59 != 0) * (uVar59 < 0x100) * (char)uVar59 - (0xff < uVar59);
            auVar72[0] = (uVar58 != 0) * (uVar58 < 0x100) * (char)uVar58 - (0xff < uVar58);
            auVar72[2] = (uVar60 != 0) * (uVar60 < 0x100) * (char)uVar60 - (0xff < uVar60);
            auVar72[3] = (uVar61 != 0) * (uVar61 < 0x100) * (char)uVar61 - (0xff < uVar61);
            auVar72[4] = (uVar75 != 0) * (uVar75 < 0x100) * (char)uVar75 - (0xff < uVar75);
            auVar72[5] = (uVar76 != 0) * (uVar76 < 0x100) * (char)uVar76 - (0xff < uVar76);
            auVar72[6] = (uVar77 != 0) * (uVar77 < 0x100) * (char)uVar77 - (0xff < uVar77);
            auVar72[7] = (uVar78 != 0) * (uVar78 < 0x100) * (char)uVar78 - (0xff < uVar78);
            auVar72[8] = (uVar26 != 0) * (uVar26 < 0x100) * (char)uVar26 - (0xff < uVar26);
            auVar72[9] = (uVar28 != 0) * (uVar28 < 0x100) * (char)uVar28 - (0xff < uVar28);
            auVar72[10] = (uVar30 != 0) * (uVar30 < 0x100) * (char)uVar30 - (0xff < uVar30);
            auVar72[0xb] = (uVar31 != 0) * (uVar31 < 0x100) * (char)uVar31 - (0xff < uVar31);
            auVar72[0xc] = (uVar50 != 0) * (uVar50 < 0x100) * (char)uVar50 - (0xff < uVar50);
            auVar72[0xd] = (uVar55 != 0) * (uVar55 < 0x100) * (char)uVar55 - (0xff < uVar55);
            auVar72[0xe] = (uVar56 != 0) * (uVar56 < 0x100) * (char)uVar56 - (0xff < uVar56);
            auVar72[0xf] = (uVar57 != 0) * (uVar57 < 0x100) * (char)uVar57 - (0xff < uVar57);
          }
          if ((int)uVar11 < -1) {
            auVar19 = pshuflw(ZEXT416((uint)lVar4),ZEXT416((uint)lVar4),0);
            uVar14 = auVar19._0_4_;
            auVar21._4_4_ = uVar14;
            auVar21._0_4_ = uVar14;
            auVar21._8_4_ = uVar14;
            auVar21._12_4_ = uVar14;
            auVar21 = auVar21 | _DAT_0050db80;
            sVar12 = auVar19._0_2_;
            sVar36 = auVar19._2_2_;
            uVar26 = auVar21._0_2_ * sVar24;
            uVar28 = auVar21._2_2_ * sVar25;
            uVar30 = auVar21._4_2_ * sVar24;
            uVar31 = auVar21._6_2_ * sVar25;
            uVar50 = auVar21._8_2_ * sVar24;
            uVar55 = auVar21._10_2_ * sVar25;
            uVar56 = auVar21._12_2_ * sVar24;
            uVar57 = auVar21._14_2_ * sVar25;
            uVar58 = (sVar12 + 9) * sVar24;
            uVar59 = (sVar36 + 10) * sVar25;
            uVar60 = (sVar12 + 0xb) * sVar24;
            uVar61 = (sVar36 + 0xc) * sVar25;
            uVar75 = (sVar12 + 0xd) * sVar24;
            uVar76 = (sVar36 + 0xe) * sVar25;
            uVar77 = (sVar12 + 0xf) * sVar24;
            uVar78 = (sVar36 + 0x10) * sVar25;
            auVar67._0_2_ =
                 auVar64._0_2_ - ((ushort)(0x7fff < uVar26) * 0x7fff | (0x7fff >= uVar26) * uVar26);
            auVar67._2_2_ =
                 auVar64._2_2_ - ((ushort)(0x7fff < uVar28) * 0x7fff | (0x7fff >= uVar28) * uVar28);
            auVar67._4_2_ =
                 auVar64._4_2_ - ((ushort)(0x7fff < uVar30) * 0x7fff | (0x7fff >= uVar30) * uVar30);
            auVar67._6_2_ =
                 auVar64._6_2_ - ((ushort)(0x7fff < uVar31) * 0x7fff | (0x7fff >= uVar31) * uVar31);
            auVar67._8_2_ =
                 auVar64._8_2_ - ((ushort)(0x7fff < uVar50) * 0x7fff | (0x7fff >= uVar50) * uVar50);
            auVar67._10_2_ =
                 auVar64._10_2_ - ((ushort)(0x7fff < uVar55) * 0x7fff | (0x7fff >= uVar55) * uVar55)
            ;
            auVar67._12_2_ =
                 auVar64._12_2_ - ((ushort)(0x7fff < uVar56) * 0x7fff | (0x7fff >= uVar56) * uVar56)
            ;
            auVar67._14_2_ =
                 auVar64._14_2_ - ((ushort)(0x7fff < uVar57) * 0x7fff | (0x7fff >= uVar57) * uVar57)
            ;
            auVar22._0_2_ =
                 auVar64._0_2_ - ((ushort)(0x7fff < uVar58) * 0x7fff | (0x7fff >= uVar58) * uVar58);
            auVar22._2_2_ =
                 auVar64._2_2_ - ((ushort)(0x7fff < uVar59) * 0x7fff | (0x7fff >= uVar59) * uVar59);
            auVar22._4_2_ =
                 auVar64._4_2_ - ((ushort)(0x7fff < uVar60) * 0x7fff | (0x7fff >= uVar60) * uVar60);
            auVar22._6_2_ =
                 auVar64._6_2_ - ((ushort)(0x7fff < uVar61) * 0x7fff | (0x7fff >= uVar61) * uVar61);
            auVar22._8_2_ =
                 auVar64._8_2_ - ((ushort)(0x7fff < uVar75) * 0x7fff | (0x7fff >= uVar75) * uVar75);
            auVar22._10_2_ =
                 auVar64._10_2_ - ((ushort)(0x7fff < uVar76) * 0x7fff | (0x7fff >= uVar76) * uVar76)
            ;
            auVar22._12_2_ =
                 auVar64._12_2_ - ((ushort)(0x7fff < uVar77) * 0x7fff | (0x7fff >= uVar77) * uVar77)
            ;
            auVar22._14_2_ =
                 auVar64._14_2_ - ((ushort)(0x7fff < uVar78) * 0x7fff | (0x7fff >= uVar78) * uVar78)
            ;
            auVar19 = psraw(auVar67,6);
            auVar66 = psraw(auVar22,6);
            sVar36 = auVar66._0_2_;
            auVar38._0_2_ = -(ushort)(sVar36 < -1) | (ushort)(sVar36 >= -1) * sVar36;
            sVar41 = auVar66._2_2_;
            auVar38._2_2_ = -(ushort)(sVar41 < -1) | (ushort)(sVar41 >= -1) * sVar41;
            sVar42 = auVar66._4_2_;
            auVar38._4_2_ = -(ushort)(sVar42 < -1) | (ushort)(sVar42 >= -1) * sVar42;
            sVar43 = auVar66._6_2_;
            auVar38._6_2_ = -(ushort)(sVar43 < -1) | (ushort)(sVar43 >= -1) * sVar43;
            sVar44 = auVar66._8_2_;
            auVar38._8_2_ = -(ushort)(sVar44 < -1) | (ushort)(sVar44 >= -1) * sVar44;
            sVar45 = auVar66._10_2_;
            auVar38._10_2_ = -(ushort)(sVar45 < -1) | (ushort)(sVar45 >= -1) * sVar45;
            sVar46 = auVar66._12_2_;
            sVar47 = auVar66._14_2_;
            auVar38._12_2_ = -(ushort)(sVar46 < -1) | (ushort)(sVar46 >= -1) * sVar46;
            auVar38._14_2_ = -(ushort)(sVar47 < -1) | (ushort)(sVar47 >= -1) * sVar47;
            sVar82 = auVar19._0_2_;
            auVar85._0_2_ = -(ushort)(sVar82 < -1) | (ushort)(sVar82 >= -1) * sVar82;
            sVar88 = auVar19._2_2_;
            auVar85._2_2_ = -(ushort)(sVar88 < -1) | (ushort)(sVar88 >= -1) * sVar88;
            sVar89 = auVar19._4_2_;
            auVar85._4_2_ = -(ushort)(sVar89 < -1) | (ushort)(sVar89 >= -1) * sVar89;
            sVar90 = auVar19._6_2_;
            auVar85._6_2_ = -(ushort)(sVar90 < -1) | (ushort)(sVar90 >= -1) * sVar90;
            sVar91 = auVar19._8_2_;
            auVar85._8_2_ = -(ushort)(sVar91 < -1) | (ushort)(sVar91 >= -1) * sVar91;
            sVar92 = auVar19._10_2_;
            auVar85._10_2_ = -(ushort)(sVar92 < -1) | (ushort)(sVar92 >= -1) * sVar92;
            sVar93 = auVar19._12_2_;
            sVar94 = auVar19._14_2_;
            auVar85._12_2_ = -(ushort)(sVar93 < -1) | (ushort)(sVar93 >= -1) * sVar93;
            auVar85._14_2_ = -(ushort)(sVar94 < -1) | (ushort)(sVar94 >= -1) * sVar94;
            sVar12 = auVar85._0_2_ - auVar38._14_2_;
            if (sVar12 < 0x10) {
              auVar19 = pshufhw(auVar19,auVar38,0xff);
              sVar36 = auVar19._8_2_;
              auVar86._0_2_ = auVar85._0_2_ - sVar36;
              sVar41 = auVar19._10_2_;
              auVar86._2_2_ = auVar85._2_2_ - sVar41;
              auVar86._4_2_ = auVar85._4_2_ - sVar36;
              auVar86._6_2_ = auVar85._6_2_ - sVar41;
              auVar86._8_2_ = auVar85._8_2_ - sVar36;
              auVar86._10_2_ = auVar85._10_2_ - sVar41;
              auVar86._12_2_ = auVar85._12_2_ - sVar36;
              auVar86._14_2_ = auVar85._14_2_ - sVar41;
              auVar39._0_2_ = auVar38._0_2_ - sVar36;
              auVar39._2_2_ = auVar38._2_2_ - sVar41;
              auVar39._4_2_ = auVar38._4_2_ - sVar36;
              auVar39._6_2_ = auVar38._6_2_ - sVar41;
              auVar39._8_2_ = auVar38._8_2_ - sVar36;
              auVar39._10_2_ = auVar38._10_2_ - sVar41;
              auVar39._12_2_ = auVar38._12_2_ - sVar36;
              auVar39._14_2_ = auVar38._14_2_ - sVar41;
              auVar19 = packsswb(auVar86,auVar39);
              sVar36 = sVar12 + 3;
              if (-1 < sVar12) {
                sVar36 = sVar12;
              }
              auVar66 = *(undefined1 (*) [16])LoadMaskz2[(short)((uint)(int)sVar36 >> 2)];
              auVar37 = pshufb(*(undefined1 (*) [16])(left + (short)auVar38._14_2_) & auVar66,
                               auVar19);
              auVar73 = pshufb(*(undefined1 (*) [16])(left + (long)(short)auVar38._14_2_ + 1) &
                               auVar66,auVar19);
              auVar87 = pmovzxbw(auVar19,auVar37);
              auVar80 = pmovzxbw(auVar66,auVar73);
              auVar40[1] = 0;
              auVar40[0] = auVar37[8];
              auVar40[2] = auVar37[9];
              auVar40[3] = 0;
              auVar40[4] = auVar37[10];
              auVar40[5] = 0;
              auVar40[6] = auVar37[0xb];
              auVar40[7] = 0;
              auVar40[8] = auVar37[0xc];
              auVar40[9] = 0;
              auVar40[10] = auVar37[0xd];
              auVar40[0xb] = 0;
              auVar40[0xc] = auVar37[0xe];
              auVar40[0xd] = 0;
              auVar40[0xe] = auVar37[0xf];
              auVar40[0xf] = 0;
              auVar96[1] = 0;
              auVar96[0] = auVar73[8];
              auVar96[2] = auVar73[9];
              auVar96[3] = 0;
              auVar96[4] = auVar73[10];
              auVar96[5] = 0;
              auVar96[6] = auVar73[0xb];
              auVar96[7] = 0;
              auVar96[8] = auVar73[0xc];
              auVar96[9] = 0;
              auVar96[10] = auVar73[0xd];
              auVar96[0xb] = 0;
              auVar96[0xc] = auVar73[0xe];
              auVar96[0xd] = 0;
              auVar96[0xe] = auVar73[0xf];
              auVar96[0xf] = 0;
            }
            else {
              auVar95._0_2_ = -(ushort)(auVar16._0_2_ < sVar36);
              auVar95._2_2_ = -(ushort)(auVar16._2_2_ < sVar41);
              auVar95._4_2_ = -(ushort)(auVar16._4_2_ < sVar42);
              auVar95._6_2_ = -(ushort)(auVar16._6_2_ < sVar43);
              auVar95._8_2_ = -(ushort)(auVar16._8_2_ < sVar44);
              auVar95._10_2_ = -(ushort)(auVar16._10_2_ < sVar45);
              auVar95._12_2_ = -(ushort)(auVar16._12_2_ < sVar46);
              auVar95._14_2_ = -(ushort)(auVar16._14_2_ < sVar47);
              auVar81._0_2_ = -(ushort)(auVar16._0_2_ < sVar82);
              auVar81._2_2_ = -(ushort)(auVar16._2_2_ < sVar88);
              auVar81._4_2_ = -(ushort)(auVar16._4_2_ < sVar89);
              auVar81._6_2_ = -(ushort)(auVar16._6_2_ < sVar90);
              auVar81._8_2_ = -(ushort)(auVar16._8_2_ < sVar91);
              auVar81._10_2_ = -(ushort)(auVar16._10_2_ < sVar92);
              auVar81._12_2_ = -(ushort)(auVar16._12_2_ < sVar93);
              auVar81._14_2_ = -(ushort)(auVar16._14_2_ < sVar94);
              auVar81 = auVar81 & auVar85;
              auVar95 = auVar95 & auVar38;
              auVar87._8_8_ =
                   (ulong)left[auVar81._8_2_] | (ulong)left[auVar81._10_2_] << 0x10 |
                   (ulong)left[auVar81._12_2_] << 0x20 | (ulong)left[auVar81._14_2_] << 0x30;
              auVar87._0_8_ =
                   (ulong)left[auVar81._0_2_] | (ulong)left[auVar81._2_2_] << 0x10 |
                   (ulong)left[auVar81._4_2_] << 0x20 | (ulong)left[auVar81._6_2_] << 0x30;
              auVar40._8_8_ =
                   (ulong)left[auVar95._8_2_] | (ulong)left[auVar95._10_2_] << 0x10 |
                   (ulong)left[auVar95._12_2_] << 0x20 | (ulong)left[auVar95._14_2_] << 0x30;
              auVar40._0_8_ =
                   (ulong)left[auVar95._0_2_] | (ulong)left[auVar95._2_2_] << 0x10 |
                   (ulong)left[auVar95._4_2_] << 0x20 | (ulong)left[auVar95._6_2_] << 0x30;
              auVar80._8_8_ =
                   (ulong)left[(short)(auVar81._8_2_ + 1)] |
                   (ulong)left[(short)(auVar81._10_2_ + 1)] << 0x10 |
                   (ulong)left[(short)(auVar81._12_2_ + 1)] << 0x20 |
                   (ulong)left[(short)(auVar81._14_2_ + 1)] << 0x30;
              auVar80._0_8_ =
                   (ulong)left[(short)(auVar81._0_2_ + 1)] |
                   (ulong)left[(short)(auVar81._2_2_ + 1)] << 0x10 |
                   (ulong)left[(short)(auVar81._4_2_ + 1)] << 0x20 |
                   (ulong)left[(short)(auVar81._6_2_ + 1)] << 0x30;
              auVar96._8_8_ =
                   (ulong)left[(short)(auVar95._8_2_ + 1)] |
                   (ulong)left[(short)(auVar95._10_2_ + 1)] << 0x10 |
                   (ulong)left[(short)(auVar95._12_2_ + 1)] << 0x20 |
                   (ulong)left[(short)(auVar95._14_2_ + 1)] << 0x30;
              auVar96._0_8_ =
                   (ulong)left[(short)(auVar95._0_2_ + 1)] |
                   (ulong)left[(short)(auVar95._2_2_ + 1)] << 0x10 |
                   (ulong)left[(short)(auVar95._4_2_ + 1)] << 0x20 |
                   (ulong)left[(short)(auVar95._6_2_ + 1)] << 0x30;
            }
            auVar68._0_2_ = auVar67._0_2_ >> 1;
            auVar68._2_2_ = auVar67._2_2_ >> 1;
            auVar68._4_2_ = auVar67._4_2_ >> 1;
            auVar68._6_2_ = auVar67._6_2_ >> 1;
            auVar68._8_2_ = auVar67._8_2_ >> 1;
            auVar68._10_2_ = auVar67._10_2_ >> 1;
            auVar68._12_2_ = auVar67._12_2_ >> 1;
            auVar68._14_2_ = auVar67._14_2_ >> 1;
            auVar68 = auVar68 & auVar49;
            auVar23._0_2_ = auVar22._0_2_ >> 1;
            auVar23._2_2_ = auVar22._2_2_ >> 1;
            auVar23._4_2_ = auVar22._4_2_ >> 1;
            auVar23._6_2_ = auVar22._6_2_ >> 1;
            auVar23._8_2_ = auVar22._8_2_ >> 1;
            auVar23._10_2_ = auVar22._10_2_ >> 1;
            auVar23._12_2_ = auVar22._12_2_ >> 1;
            auVar23._14_2_ = auVar22._14_2_ >> 1;
            auVar23 = auVar23 & auVar49;
            auVar19 = psllw(auVar87,5);
            uVar58 = (ushort)(auVar19._0_2_ + sVar27 +
                             (auVar80._0_2_ - auVar87._0_2_) * auVar68._0_2_) >> 5;
            uVar59 = (ushort)(auVar19._2_2_ + sVar29 +
                             (auVar80._2_2_ - auVar87._2_2_) * auVar68._2_2_) >> 5;
            uVar60 = (ushort)(auVar19._4_2_ + sVar62 +
                             (auVar80._4_2_ - auVar87._4_2_) * auVar68._4_2_) >> 5;
            uVar61 = (ushort)(auVar19._6_2_ + sVar69 +
                             (auVar80._6_2_ - auVar87._6_2_) * auVar68._6_2_) >> 5;
            uVar75 = (ushort)(auVar19._8_2_ + sVar32 +
                             (auVar80._8_2_ - auVar87._8_2_) * auVar68._8_2_) >> 5;
            uVar76 = (ushort)(auVar19._10_2_ + sVar33 +
                             (auVar80._10_2_ - auVar87._10_2_) * auVar68._10_2_) >> 5;
            uVar77 = (ushort)(auVar19._12_2_ + sVar34 +
                             (auVar80._12_2_ - auVar87._12_2_) * auVar68._12_2_) >> 5;
            uVar78 = (ushort)(auVar19._14_2_ + sVar35 +
                             (auVar80._14_2_ - auVar87._14_2_) * auVar68._14_2_) >> 5;
            auVar19 = psllw(auVar40,5);
            uVar26 = (ushort)(auVar19._0_2_ + sVar27 +
                             (auVar96._0_2_ - auVar40._0_2_) * auVar23._0_2_) >> 5;
            uVar28 = (ushort)(auVar19._2_2_ + sVar29 +
                             (auVar96._2_2_ - auVar40._2_2_) * auVar23._2_2_) >> 5;
            uVar30 = (ushort)(auVar19._4_2_ + sVar62 +
                             (auVar96._4_2_ - auVar40._4_2_) * auVar23._4_2_) >> 5;
            uVar31 = (ushort)(auVar19._6_2_ + sVar69 +
                             (auVar96._6_2_ - auVar40._6_2_) * auVar23._6_2_) >> 5;
            uVar50 = (ushort)(auVar19._8_2_ + sVar32 +
                             (auVar96._8_2_ - auVar40._8_2_) * auVar23._8_2_) >> 5;
            uVar55 = (ushort)(auVar19._10_2_ + sVar33 +
                             (auVar96._10_2_ - auVar40._10_2_) * auVar23._10_2_) >> 5;
            uVar56 = (ushort)(auVar19._12_2_ + sVar34 +
                             (auVar96._12_2_ - auVar40._12_2_) * auVar23._12_2_) >> 5;
            uVar57 = (ushort)(auVar19._14_2_ + sVar35 +
                             (auVar96._14_2_ - auVar40._14_2_) * auVar23._14_2_) >> 5;
            auVar84[1] = (uVar59 != 0) * (uVar59 < 0x100) * (char)uVar59 - (0xff < uVar59);
            auVar84[0] = (uVar58 != 0) * (uVar58 < 0x100) * (char)uVar58 - (0xff < uVar58);
            auVar84[2] = (uVar60 != 0) * (uVar60 < 0x100) * (char)uVar60 - (0xff < uVar60);
            auVar84[3] = (uVar61 != 0) * (uVar61 < 0x100) * (char)uVar61 - (0xff < uVar61);
            auVar84[4] = (uVar75 != 0) * (uVar75 < 0x100) * (char)uVar75 - (0xff < uVar75);
            auVar84[5] = (uVar76 != 0) * (uVar76 < 0x100) * (char)uVar76 - (0xff < uVar76);
            auVar84[6] = (uVar77 != 0) * (uVar77 < 0x100) * (char)uVar77 - (0xff < uVar77);
            auVar84[7] = (uVar78 != 0) * (uVar78 < 0x100) * (char)uVar78 - (0xff < uVar78);
            auVar84[8] = (uVar26 != 0) * (uVar26 < 0x100) * (char)uVar26 - (0xff < uVar26);
            auVar84[9] = (uVar28 != 0) * (uVar28 < 0x100) * (char)uVar28 - (0xff < uVar28);
            auVar84[10] = (uVar30 != 0) * (uVar30 < 0x100) * (char)uVar30 - (0xff < uVar30);
            auVar84[0xb] = (uVar31 != 0) * (uVar31 < 0x100) * (char)uVar31 - (0xff < uVar31);
            auVar84[0xc] = (uVar50 != 0) * (uVar50 < 0x100) * (char)uVar50 - (0xff < uVar50);
            auVar84[0xd] = (uVar55 != 0) * (uVar55 < 0x100) * (char)uVar55 - (0xff < uVar55);
            auVar84[0xe] = (uVar56 != 0) * (uVar56 < 0x100) * (char)uVar56 - (0xff < uVar56);
            auVar84[0xf] = (uVar57 != 0) * (uVar57 < 0x100) * (char)uVar57 - (0xff < uVar57);
          }
          auVar19 = pblendvb(auVar72,auVar84,(undefined1  [16])Mask[0][uVar7]);
          *(undefined1 (*) [16])(dst + lVar4) = auVar19;
          lVar4 = lVar4 + 0x10;
          uVar9 = uVar9 - 0x10;
        } while (lVar4 < bw);
      }
      local_5c = local_5c + 1;
      dst = dst + stride;
    } while (local_5c != bh);
  }
  return;
}

Assistant:

void av1_dr_prediction_z2_sse4_1(uint8_t *dst, ptrdiff_t stride, int bw, int bh,
                                 const uint8_t *above, const uint8_t *left,
                                 int upsample_above, int upsample_left, int dx,
                                 int dy) {
  assert(dx > 0);
  assert(dy > 0);
  switch (bw) {
    case 4:
      dr_prediction_z2_Nx4_sse4_1(bh, dst, stride, above, left, upsample_above,
                                  upsample_left, dx, dy);
      break;
    case 8:
      dr_prediction_z2_Nx8_sse4_1(bh, dst, stride, above, left, upsample_above,
                                  upsample_left, dx, dy);
      break;
    default:
      dr_prediction_z2_HxW_sse4_1(bh, bw, dst, stride, above, left,
                                  upsample_above, upsample_left, dx, dy);
  }
  return;
}